

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O0

void __thiscall
rengine::GlyphTextureJob::renderSingleGlyph
          (GlyphTextureJob *this,int x,int y,uint *t,int tw,int th,uchar *b,int bw,int bh,int cr,
          int cg,int cb,int ca)

{
  int iVar1;
  int iVar2;
  int local_58;
  int local_54;
  int b_1;
  int g;
  int r;
  int alpha;
  uchar s;
  int xx;
  uint *dst;
  uchar *src;
  int dy;
  int yy;
  int th_local;
  int tw_local;
  uint *t_local;
  int y_local;
  int x_local;
  GlyphTextureJob *this_local;
  
  src._4_4_ = 0;
  do {
    if (bh <= src._4_4_) {
      return;
    }
    iVar1 = src._4_4_ + y;
    if (iVar1 < 0) {
      __assert_fail("dy >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xe0,
                    "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                   );
    }
    if (th <= iVar1) {
      __assert_fail("dy < th",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xe1,
                    "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                   );
    }
    for (alpha = 0; alpha < bw; alpha = alpha + 1) {
      if (x + alpha < 0) {
        __assert_fail("x + xx >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xea,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (tw <= x + alpha) {
        __assert_fail("x + xx < tw",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xeb,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (b[(long)alpha + (long)(src._4_4_ * bw)] != 0) {
        iVar2 = (int)(ca * (uint)b[(long)alpha + (long)(src._4_4_ * bw)]) / 0xff;
        if (iVar2 == 0xff) {
          b_1 = cr;
          local_54 = cg;
          local_58 = cb;
        }
        else {
          b_1 = iVar2 * cr >> 8;
          local_54 = iVar2 * cg >> 8;
          local_58 = iVar2 * cb >> 8;
        }
        t[(long)(iVar1 * tw) + (long)x + (long)alpha] =
             iVar2 << 0x18 | local_58 << 0x10 | local_54 << 8 | b_1;
      }
    }
    src._4_4_ = src._4_4_ + 1;
  } while( true );
}

Assistant:

inline void GlyphTextureJob::renderSingleGlyph(int x, int y,
                                        unsigned int *t, int tw, int th,
                                        unsigned char *b, int bw, int bh,
                                        int cr, int cg, int cb, int ca)
{
    for (int yy=0; yy<bh; ++yy) {
        int dy = yy + y;

        assert(dy >= 0);
        assert(dy < th);
        // if (yy + y < 0)
        //     continue;
        // else if (yy + y > ctx->buffer->height)
        //     break;
        unsigned char *src = b + yy * bw;
        unsigned int *dst = t + dy * tw + x;

        for (int xx=0; xx<bw; ++xx) {
            assert(x + xx >= 0);
            assert(x + xx < tw);
            unsigned char s = src[xx];
            if (s == 0)
                continue;
            // if (xx + x < 0)
            //     continue;
            // else if (xx + x > ctx->buffer->width)
            //     break;
            int alpha = ca * s / 255;

            int r, g, b;
            if (alpha == 255) {
                r = cr;
                g = cg;
                b = cb;
            } else {
                r = (alpha * cr) >> 8;
                g = (alpha * cg) >> 8;
                b = (alpha * cb) >> 8;
            }

            dst[xx] = (alpha << 24)
                      | (b << 16)
                      | (g << 8)
                      | r;
        }
    }
    // color[3] = alpha;

}